

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O2

fasttext_autotune_t * cft_autotune_new(fasttext_t *handle)

{
  Autotune *this;
  shared_ptr<fasttext::FastText> ft_ptr;
  
  std::__shared_ptr<fasttext::FastText,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<fasttext::FastText,void>
            ((__shared_ptr<fasttext::FastText,(__gnu_cxx::_Lock_policy)2> *)&ft_ptr,
             (FastText *)handle);
  this = (Autotune *)operator_new(0x40);
  fasttext::Autotune::Autotune(this,&ft_ptr);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ft_ptr.super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  return (fasttext_autotune_t *)this;
}

Assistant:

fasttext_autotune_t* cft_autotune_new(fasttext_t *handle) {
    FastText* ft = (FastText*)handle;
    std::shared_ptr<FastText> ft_ptr(ft);
    return (fasttext_autotune_t*)(new Autotune(ft_ptr));
}